

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

QFileDialog * __thiscall QFileDialog::directory(QFileDialog *this)

{
  qsizetype qVar1;
  long in_RSI;
  long in_FS_OFFSET;
  QUrl QStack_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(QFileDialogPrivate **)(in_RSI + 8))->super_QDialogPrivate).nativeDialogInUse == true) {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFileDialogPrivate::directory_sys((QFileDialogPrivate *)local_60);
    QUrl::toLocalFile();
    QUrl::~QUrl((QUrl *)local_60);
    qVar1 = local_48.size;
    if ((undefined1 *)local_48.size == (undefined1 *)0x0) {
      QFileDialogOptions::initialDirectory();
      QUrl::toLocalFile();
    }
    else {
      local_60._0_8_ = local_48.d;
      local_60._8_8_ = local_48.ptr;
      local_50 = (undefined1 *)local_48.size;
      if (local_48.d != (Data *)0x0) {
        LOCK();
        ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    QDir::QDir((QDir *)this,(QString *)local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_60);
    if ((undefined1 *)qVar1 == (undefined1 *)0x0) {
      QUrl::~QUrl(&QStack_68);
    }
  }
  else {
    QFileDialogPrivate::rootPath((QString *)&local_48,*(QFileDialogPrivate **)(in_RSI + 8));
    QDir::QDir((QDir *)this,(QString *)&local_48);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QDir QFileDialog::directory() const
{
    Q_D(const QFileDialog);
    if (d->nativeDialogInUse) {
        QString dir = d->directory_sys().toLocalFile();
        return QDir(dir.isEmpty() ? d->options->initialDirectory().toLocalFile() : dir);
    }
    return d->rootPath();
}